

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalSleepEx(CPalThread *pThread,DWORD dwMilliseconds,BOOL bAlertable)

{
  int iVar1;
  int iVar2;
  PAL_ERROR PVar3;
  undefined1 local_38 [4];
  undefined4 local_34;
  int iSignaledObjIndex;
  ThreadWakeupReason twrWakeupReason;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0013efe7;
  if ((bAlertable != 0) &&
     (iVar1 = (**(code **)(*g_pSynchronizationManager + 0x20))(g_pSynchronizationManager,pThread),
     iVar1 == 0)) {
    return 0xc0;
  }
  if (dwMilliseconds == 0) {
    PVar3 = 0;
  }
  else {
    iVar1 = (**(code **)*g_pSynchronizationManager)
                      (g_pSynchronizationManager,pThread,dwMilliseconds,bAlertable == 1,1,&local_34,
                       local_38);
    if (iVar1 == 0) {
      PVar3 = 0;
      switch(local_34) {
      case 0:
      case 3:
        break;
      case 1:
        if (bAlertable == 0) {
          fprintf(_stderr,"] %s %s:%d","InternalSleepEx",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                  ,0x287);
          fprintf(_stderr,
                  "Expression: bAlertable, Description: Awakened for APC from a non-alertable wait\n"
                 );
        }
        iVar2 = (**(code **)(*g_pSynchronizationManager + 0x20))(g_pSynchronizationManager,pThread);
        PVar3 = 0xc0;
        if (iVar2 != 0) {
          fprintf(_stderr,"] %s %s:%d","InternalSleepEx",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                  ,0x28d);
          fprintf(_stderr,
                  "Expression: NO_ERROR == palErr, Description: Awakened for APC, but no APC is pending\n"
                 );
        }
        break;
      case 2:
        fprintf(_stderr,"] %s %s:%d","InternalSleepEx",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/wait.cpp"
                ,0x291);
        fprintf(_stderr,"Thread %p awakened with reason=MutexAbondoned from a SleepEx\n",pThread);
        PVar3 = 0xffffffff;
        break;
      default:
        goto switchD_0013f01e_default;
      }
    }
    else {
switchD_0013f01e_default:
      PVar3 = 0xffffffff;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013efe7;
    }
    if (iVar1 != 0) {
      return PVar3;
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar3;
  }
LAB_0013efe7:
  abort();
}

Assistant:

PAL_ERROR CorUnix::InternalSleepEx (
    CPalThread * pThread,
    DWORD dwMilliseconds,
    BOOL bAlertable)
{
    PAL_ERROR palErr = NO_ERROR;
    DWORD dwRet = WAIT_FAILED;
    int iSignaledObjIndex;

    TRACE("Sleeping %u ms [bAlertable=%d]", dwMilliseconds, (int)bAlertable);

    if (bAlertable)
    {
        // In this case do not use AreAPCsPending. In fact, since we are
        // not holding the synch lock(s) an APC posting may race with
        // AreAPCsPending.
        palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);
        if (NO_ERROR == palErr)
        {
            dwRet = WAIT_IO_COMPLETION;
            goto InternalSleepExExit;
        }
        else if (ERROR_NOT_FOUND == palErr)
        {
            // No APC was pending, just continue
            palErr = NO_ERROR;
        }
    }

    if (dwMilliseconds > 0)
    {
        ThreadWakeupReason twrWakeupReason;

        palErr = g_pSynchronizationManager->BlockThread(pThread,
                                                        dwMilliseconds,
                                                        (TRUE == bAlertable),
                                                        true,
                                                        &twrWakeupReason,
                                                        (DWORD *)&iSignaledObjIndex);
        if (NO_ERROR != palErr)
        {
            ERROR("IPalSynchronizationManager::BlockThread failed for thread "
                  "pThread=%p [error=%u]\n", pThread, palErr);
            goto InternalSleepExExit;
        }

        switch (twrWakeupReason)
        {
        case WaitSucceeded:
        case WaitTimeout:
            dwRet = 0;
            break;
        case Alerted:
            _ASSERT_MSG(bAlertable,
                        "Awakened for APC from a non-alertable wait\n");

            dwRet = WAIT_IO_COMPLETION;
            palErr = g_pSynchronizationManager->DispatchPendingAPCs(pThread);

            _ASSERT_MSG(NO_ERROR == palErr,
                        "Awakened for APC, but no APC is pending\n");
            break;
        case MutexAbondoned:
            ASSERT("Thread %p awakened with reason=MutexAbondoned from a "
                   "SleepEx\n", pThread);
            palErr = ERROR_INTERNAL_ERROR;
            break;
        case WaitFailed:
        default:
            ERROR("Thread %p awakened with some failure\n", pThread);
            palErr = ERROR_INTERNAL_ERROR;
            break;
        }
    }
    else
    {
        dwRet = 0;
    }

    TRACE("Done sleeping %u ms [bAlertable=%d]", dwMilliseconds, (int)bAlertable);

InternalSleepExExit:
    return dwRet;
}